

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O2

void __thiscall ItemTable::BlueRoomOne(ItemTable *this)

{
  ItemWrapper *this_00;
  ItemWrapper *this_01;
  mapped_type *ppIVar1;
  key_type local_b4;
  string local_b0;
  string local_90;
  Item local_70;
  Item local_48;
  
  this_00 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_90,"A Torch",(allocator *)&local_b4);
  Item::Item(&local_48,&local_90,TORCH);
  ItemWrapper::ItemWrapper(this_00,&local_48,HIDDEN);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_90);
  this_01 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_b0,"Stairs",(allocator *)&local_b4);
  Item::Item(&local_70,&local_b0,STAIRS);
  ItemWrapper::ItemWrapper(this_01,&local_70,HIDDEN);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b0);
  local_b4 = TORCH;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_b4);
  *ppIVar1 = this_00;
  local_b4 = STAIRS;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_b4);
  *ppIVar1 = this_01;
  return;
}

Assistant:

void ItemTable::BlueRoomOne() {
    ItemWrapper * Torch = new ItemWrapper(Item("A Torch", TORCH), HIDDEN);
    ItemWrapper * Stairs = new ItemWrapper(Item("Stairs", STAIRS), HIDDEN);
    items[TORCH] = Torch;
    items[STAIRS] = Stairs;
}